

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetWindowFocus(char *name)

{
  ImGuiWindow *window;
  
  if (name == (char *)0x0) {
    FocusWindow((ImGuiWindow *)0x0);
    return;
  }
  window = FindWindowByName(name);
  if (window != (ImGuiWindow *)0x0) {
    FocusWindow(window);
    return;
  }
  return;
}

Assistant:

void ImGui::SetWindowFocus(const char* name)
{
    if (name)
    {
        if (ImGuiWindow* window = FindWindowByName(name))
            FocusWindow(window);
    }
    else
    {
        FocusWindow(NULL);
    }
}